

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void Acb_IntallLibrary(void)

{
  char cVar1;
  uint uVar2;
  size_t __size;
  uint *__ptr;
  void *pvVar3;
  size_t sVar4;
  long lVar5;
  Mio_Library_t *pLib;
  char *pName;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar3 = malloc(1000);
  *(void **)(__ptr + 2) = pvVar3;
  if (pLibStr[0] == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    lVar5 = 0;
    pcVar7 = pLibStr[0];
    do {
      sVar4 = strlen(pcVar7);
      if (0 < (int)(uint)sVar4) {
        uVar6 = 0;
        do {
          cVar1 = pcVar7[uVar6];
          uVar8 = __ptr[1];
          if (uVar8 == *__ptr) {
            if ((int)uVar8 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar3 = malloc(0x10);
              }
              else {
                pvVar3 = realloc(*(void **)(__ptr + 2),0x10);
              }
              *(void **)(__ptr + 2) = pvVar3;
              *__ptr = 0x10;
            }
            else {
              __size = (ulong)uVar8 * 2;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar3 = malloc(__size);
              }
              else {
                pvVar3 = realloc(*(void **)(__ptr + 2),__size);
              }
              *(void **)(__ptr + 2) = pvVar3;
              *__ptr = (uint)__size;
            }
          }
          else {
            pvVar3 = *(void **)(__ptr + 2);
          }
          __ptr[1] = uVar8 + 1;
          *(char *)((long)pvVar3 + (long)(int)uVar8) = cVar1;
          uVar6 = uVar6 + 1;
        } while (((uint)sVar4 & 0x7fffffff) != uVar6);
      }
      pcVar7 = pLibStr[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (pcVar7 != (char *)0x0);
    uVar2 = *__ptr;
    uVar8 = __ptr[1];
    if (uVar8 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar3 = malloc(0x10);
        }
        else {
          pvVar3 = realloc(*(void **)(__ptr + 2),0x10);
        }
        *(void **)(__ptr + 2) = pvVar3;
        *__ptr = 0x10;
      }
      else {
        sVar4 = (ulong)uVar2 * 2;
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar3 = malloc(sVar4);
        }
        else {
          pvVar3 = realloc(*(void **)(__ptr + 2),sVar4);
        }
        *(void **)(__ptr + 2) = pvVar3;
        *__ptr = (uint)sVar4;
      }
      goto LAB_0036c8f2;
    }
  }
  pvVar3 = *(void **)(__ptr + 2);
LAB_0036c8f2:
  __ptr[1] = uVar8 + 1;
  *(undefined1 *)((long)pvVar3 + (long)(int)uVar8) = 0;
  pcVar7 = *(char **)(__ptr + 2);
  pLib = Mio_LibraryReadBuffer(pcVar7,0,(st__table *)0x0,0);
  pName = (char *)malloc(0xf);
  builtin_strncpy(pName,"iccad17.genlib",0xf);
  Mio_LibrarySetName(pLib,pName);
  Mio_UpdateGenlib(pLib);
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
  }
  free(__ptr);
  return;
}

Assistant:

void Acb_IntallLibrary()
{
    extern Mio_Library_t * Mio_LibraryReadBuffer( char * pBuffer, int fExtendedFormat, st__table * tExcludeGate, int fVerbose );
    Mio_Library_t * pLib;
    int i;
    // create library string
    Vec_Str_t * vLibStr = Vec_StrAlloc( 1000 );
    for ( i = 0; pLibStr[i]; i++ )
        Vec_StrAppend( vLibStr, pLibStr[i] );
    Vec_StrPush( vLibStr, '\0' );
    // create library
    pLib = Mio_LibraryReadBuffer( Vec_StrArray(vLibStr), 0, NULL, 0 );
    Mio_LibrarySetName( pLib, Abc_UtilStrsav("iccad17.genlib") );
    Mio_UpdateGenlib( pLib );
    Vec_StrFree( vLibStr );
}